

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

void pospopcnt_u8_avx512bw_popcnt4bit(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [64];
  ulong uVar2;
  int j;
  int iVar3;
  long lVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined8 uVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 in_ZMM16 [64];
  
  auVar7 = in_ZMM16._0_16_;
  if ((len & 0xffffffffffffff00) == 0) {
    auVar31 = ZEXT1664((undefined1  [16])0x0);
    bVar5 = true;
    auVar42 = ZEXT1664((undefined1  [16])0x0);
    auVar46 = ZEXT1664((undefined1  [16])0x0);
    auVar47 = ZEXT1664((undefined1  [16])0x0);
    auVar48 = ZEXT1664((undefined1  [16])0x0);
    auVar50 = ZEXT1664((undefined1  [16])0x0);
    auVar51 = ZEXT1664((undefined1  [16])0x0);
    auVar52 = ZEXT1664((undefined1  [16])0x0);
    auVar49 = ZEXT1664((undefined1  [16])0x0);
    auVar33 = ZEXT1664((undefined1  [16])0x0);
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    auVar37 = ZEXT1664((undefined1  [16])0x0);
    auVar41 = ZEXT1664((undefined1  [16])0x0);
    auVar36 = ZEXT1664((undefined1  [16])0x0);
    auVar34 = ZEXT1664((undefined1  [16])0x0);
  }
  else {
    pauVar1 = (undefined1 (*) [64])(data + (len & 0xffffffffffffff00));
    auVar49 = ZEXT1664((undefined1  [16])0x0);
    iVar3 = 0;
    auVar34 = ZEXT1664((undefined1  [16])0x0);
    auVar16 = vpbroadcastq_avx512f(ZEXT816(0x5555555555555555));
    auVar7 = auVar16._0_16_;
    auVar17 = vpbroadcastq_avx512f(ZEXT816(0xaaaaaaaaaaaaaaaa));
    auVar18 = vpbroadcastq_avx512f(ZEXT816(0x3333333333333333));
    auVar19 = vpbroadcastq_avx512f(ZEXT816(0xcccccccccccccccc));
    auVar20 = vpbroadcastb_avx512bw(ZEXT116(0xf));
    auVar21 = vbroadcasti32x4_avx512f(_DAT_0011a1c0);
    auVar36 = ZEXT1664((undefined1  [16])0x0);
    auVar41 = ZEXT1664((undefined1  [16])0x0);
    auVar37 = ZEXT1664((undefined1  [16])0x0);
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    auVar33 = ZEXT1664((undefined1  [16])0x0);
    auVar31 = ZEXT1664((undefined1  [16])0x0);
    auVar52 = ZEXT1664((undefined1  [16])0x0);
    auVar51 = ZEXT1664((undefined1  [16])0x0);
    auVar50 = ZEXT1664((undefined1  [16])0x0);
    auVar48 = ZEXT1664((undefined1  [16])0x0);
    auVar47 = ZEXT1664((undefined1  [16])0x0);
    auVar46 = ZEXT1664((undefined1  [16])0x0);
    auVar42 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar22 = vmovdqu64_avx512f(*(undefined1 (*) [64])data);
      auVar23 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + 0x40));
      auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + 0x80));
      auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + 0xc0));
      auVar26 = vpaddb_avx512bw(auVar23,auVar23);
      auVar26 = vpternlogq_avx512f(auVar26,auVar17,auVar22,0xe2);
      auVar23 = vpsrld_avx512f(auVar23,1);
      auVar22 = vpternlogq_avx512f(auVar23,auVar16,auVar22,0xe2);
      auVar23 = vpaddb_avx512bw(auVar25,auVar25);
      auVar23 = vpternlogq_avx512f(auVar23,auVar17,auVar24,0xe2);
      auVar25 = vpsrld_avx512f(auVar25,1);
      auVar24 = vpternlogq_avx512f(auVar25,auVar16,auVar24,0xe2);
      auVar25 = vpslld_avx512f(auVar23,2);
      auVar25 = vpternlogq_avx512f(auVar25,auVar19,auVar26,0xe2);
      auVar27 = vpslld_avx512f(auVar24,2);
      auVar27 = vpternlogq_avx512f(auVar27,auVar19,auVar22,0xe2);
      auVar23 = vpsrld_avx512f(auVar23,2);
      auVar23 = vpternlogq_avx512f(auVar23,auVar18,auVar26,0xe2);
      auVar24 = vpsrld_avx512f(auVar24,2);
      auVar22 = vpternlogq_avx512f(auVar24,auVar18,auVar22,0xe2);
      auVar24 = vpandq_avx512f(auVar25,auVar20);
      auVar24 = vpshufb_avx512bw(auVar21,auVar24);
      auVar49 = vpaddb_avx512bw(auVar24,auVar49);
      auVar24 = vpsrld_avx512f(auVar25,4);
      auVar24 = vpandq_avx512f(auVar24,auVar20);
      auVar24 = vpshufb_avx512bw(auVar21,auVar24);
      auVar48 = vpaddb_avx512bw(auVar24,auVar48);
      auVar24 = vpandq_avx512f(auVar27,auVar20);
      auVar24 = vpshufb_avx512bw(auVar21,auVar24);
      auVar52 = vpaddb_avx512bw(auVar24,auVar52);
      auVar24 = vpsrld_avx512f(auVar27,4);
      auVar24 = vpandq_avx512f(auVar24,auVar20);
      auVar24 = vpshufb_avx512bw(auVar21,auVar24);
      auVar47 = vpaddb_avx512bw(auVar24,auVar47);
      auVar24 = vpandq_avx512f(auVar23,auVar20);
      auVar24 = vpshufb_avx512bw(auVar21,auVar24);
      auVar51 = vpaddb_avx512bw(auVar24,auVar51);
      auVar23 = vpsrld_avx512f(auVar23,4);
      auVar23 = vpandq_avx512f(auVar23,auVar20);
      auVar23 = vpshufb_avx512bw(auVar21,auVar23);
      auVar46 = vpaddb_avx512bw(auVar23,auVar46);
      auVar23 = vpandq_avx512f(auVar22,auVar20);
      auVar23 = vpshufb_avx512bw(auVar21,auVar23);
      auVar50 = vpaddb_avx512bw(auVar23,auVar50);
      auVar22 = vpsrld_avx512f(auVar22,4);
      auVar22 = vpandq_avx512f(auVar22,auVar20);
      auVar22 = vpshufb_avx512bw(auVar21,auVar22);
      auVar42 = vpaddb_avx512bw(auVar22,auVar42);
      iVar3 = iVar3 + 1;
      if (iVar3 == 0x3f) {
        auVar6 = vpxord_avx512vl(auVar22._0_16_,auVar22._0_16_);
        auVar22 = ZEXT1664(auVar6);
        auVar49 = vpsadbw_avx512bw(auVar49,auVar22);
        auVar34 = vpaddq_avx512f(auVar49,auVar34);
        auVar49 = vpsadbw_avx512bw(auVar52,auVar22);
        auVar36 = vpaddq_avx512f(auVar49,auVar36);
        auVar49 = vpsadbw_avx512bw(auVar51,auVar22);
        auVar41 = vpaddq_avx512f(auVar49,auVar41);
        auVar49 = vpsadbw_avx512bw(auVar50,auVar22);
        auVar37 = vpaddq_avx512f(auVar49,auVar37);
        auVar49 = vpsadbw_avx512bw(auVar48,auVar22);
        auVar29 = vpaddq_avx512f(auVar49,auVar29);
        auVar49 = vpsadbw_avx512bw(auVar47,auVar22);
        auVar28 = vpaddq_avx512f(auVar49,auVar28);
        auVar49 = vpsadbw_avx512bw(auVar46,auVar22);
        auVar33 = vpaddq_avx512f(auVar49,auVar33);
        auVar49 = vpsadbw_avx512bw(auVar42,auVar22);
        auVar31 = vpaddq_avx512f(auVar49,auVar31);
        iVar3 = 0;
        auVar42 = ZEXT1664((undefined1  [16])0x0);
        auVar46 = ZEXT1664((undefined1  [16])0x0);
        auVar47 = ZEXT1664((undefined1  [16])0x0);
        auVar48 = ZEXT1664((undefined1  [16])0x0);
        auVar50 = ZEXT1664((undefined1  [16])0x0);
        auVar51 = ZEXT1664((undefined1  [16])0x0);
        auVar52 = ZEXT1664((undefined1  [16])0x0);
        auVar49 = ZEXT1664((undefined1  [16])0x0);
      }
      data = (uint8_t *)((long)data + 0x100);
    } while ((undefined1 (*) [64])data != pauVar1);
    bVar5 = iVar3 == 0;
  }
  if (!bVar5) {
    auVar7 = vpxord_avx512vl(auVar7,auVar7);
    auVar16 = ZEXT1664(auVar7);
    auVar49 = vpsadbw_avx512bw(auVar49,auVar16);
    auVar34 = vpaddq_avx512f(auVar49,auVar34);
    auVar49 = vpsadbw_avx512bw(auVar52,auVar16);
    auVar36 = vpaddq_avx512f(auVar49,auVar36);
    auVar49 = vpsadbw_avx512bw(auVar51,auVar16);
    auVar41 = vpaddq_avx512f(auVar49,auVar41);
    auVar49 = vpsadbw_avx512bw(auVar50,auVar16);
    auVar37 = vpaddq_avx512f(auVar49,auVar37);
    auVar49 = vpsadbw_avx512bw(auVar48,auVar16);
    auVar29 = vpaddq_avx512f(auVar49,auVar29);
    auVar49 = vpsadbw_avx512bw(auVar47,auVar16);
    auVar28 = vpaddq_avx512f(auVar49,auVar28);
    auVar49 = vpsadbw_avx512bw(auVar46,auVar16);
    auVar33 = vpaddq_avx512f(auVar49,auVar33);
    auVar49 = vpsadbw_avx512bw(auVar42,auVar16);
    auVar31 = vpaddq_avx512f(auVar49,auVar31);
  }
  auVar32 = auVar41._0_16_;
  vpextrq_avx(auVar32,1);
  vpextrq_avx(auVar41._16_16_,1);
  auVar6 = vextracti32x4_avx512f(auVar41,2);
  vpextrq_avx(auVar6,1);
  auVar8 = vextracti32x4_avx512f(auVar41,3);
  vpextrq_avx(auVar8,1);
  vpextrq_avx(auVar37._0_16_,1);
  vpextrq_avx(auVar37._16_16_,1);
  auVar9 = vextracti32x4_avx512f(auVar37,2);
  vpextrq_avx(auVar9,1);
  auVar10 = vextracti32x4_avx512f(auVar37,3);
  vpextrq_avx(auVar10,1);
  auVar7 = vpunpcklqdq_avx(auVar34._0_16_,auVar36._0_16_);
  auVar39._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar7;
  auVar39._16_16_ = ZEXT116(1) * auVar32;
  auVar14._0_8_ = auVar37._0_8_;
  auVar14._8_8_ = auVar14._0_8_;
  auVar14._16_8_ = auVar14._0_8_;
  auVar14._24_8_ = auVar14._0_8_;
  auVar30 = vpblendd_avx2(auVar39,auVar14,0xc0);
  auVar7 = vpunpckhqdq_avx(auVar34._0_16_,auVar36._0_16_);
  auVar11 = vpbroadcastq_avx512vl();
  auVar11 = vpblendd_avx2(ZEXT1632(auVar7),auVar11,0x30);
  auVar12 = vpbroadcastq_avx512vl();
  auVar11 = vpblendd_avx2(auVar11,auVar12,0xc0);
  auVar30 = vpaddq_avx2(auVar30,auVar11);
  auVar11 = vpunpcklqdq_avx2(auVar34._0_32_,auVar36._0_32_);
  auVar11 = vperm2i128_avx2(auVar11,ZEXT1632(auVar41._16_16_),0x21);
  uVar38 = auVar37._16_8_;
  auVar43._8_8_ = uVar38;
  auVar43._0_8_ = uVar38;
  auVar43._16_8_ = uVar38;
  auVar43._24_8_ = uVar38;
  auVar11 = vpblendd_avx2(auVar11,auVar43,0xc0);
  auVar30 = vpaddq_avx2(auVar30,auVar11);
  auVar11 = vpunpckhqdq_avx2(auVar34._0_32_,auVar36._0_32_);
  auVar12 = vpbroadcastq_avx512vl();
  auVar11 = vperm2i128_avx2(auVar11,auVar12,0x31);
  auVar12 = vpbroadcastq_avx512vl();
  auVar11 = vpblendd_avx2(auVar11,auVar12,0xc0);
  auVar13 = vextracti64x4_avx512f(auVar34,1);
  auVar14 = vextracti64x4_avx512f(auVar36,1);
  auVar7 = vpunpckhqdq_avx(auVar13._0_16_,auVar14._0_16_);
  auVar12 = vpbroadcastq_avx512vl();
  auVar12 = vpblendd_avx2(ZEXT1632(auVar7),auVar12,0x30);
  auVar15 = vpbroadcastq_avx512vl();
  auVar12 = vpblendd_avx2(auVar12,auVar15,0xc0);
  auVar30 = vpaddq_avx2(auVar12,auVar30);
  auVar30 = vpaddq_avx2(auVar30,auVar11);
  auVar7 = vpunpcklqdq_avx(auVar13._0_16_,auVar14._0_16_);
  auVar40._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar7;
  auVar40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
  uVar38 = auVar9._0_8_;
  auVar44._8_8_ = uVar38;
  auVar44._0_8_ = uVar38;
  auVar44._16_8_ = uVar38;
  auVar44._24_8_ = uVar38;
  auVar12 = vpblendd_avx2(auVar40,auVar44,0xc0);
  auVar11 = vpunpcklqdq_avx2(auVar13,auVar14);
  auVar11 = vperm2i128_avx2(auVar11,ZEXT1632(auVar8),0x21);
  uVar38 = auVar10._0_8_;
  auVar45._8_8_ = uVar38;
  auVar45._0_8_ = uVar38;
  auVar45._16_8_ = uVar38;
  auVar45._24_8_ = uVar38;
  auVar11 = vpblendd_avx2(auVar11,auVar45,0xc0);
  auVar11 = vpaddq_avx2(auVar11,auVar12);
  auVar12 = vpunpckhqdq_avx2(auVar13,auVar14);
  auVar13 = vpbroadcastq_avx512vl();
  auVar12 = vperm2i128_avx2(auVar12,auVar13,0x31);
  auVar13 = vpbroadcastq_avx512vl();
  auVar12 = vpblendd_avx2(auVar12,auVar13,0xc0);
  auVar11 = vpaddq_avx2(auVar11,auVar12);
  auVar30 = vpaddq_avx2(auVar30,auVar11);
  auVar7 = vpmovqd_avx512vl(auVar30);
  auVar7 = vpaddd_avx(auVar7,*(undefined1 (*) [16])flag_counts);
  *(undefined1 (*) [16])flag_counts = auVar7;
  auVar32 = auVar33._0_16_;
  vpextrq_avx(auVar32,1);
  vpextrq_avx(auVar33._16_16_,1);
  auVar6 = vextracti32x4_avx512f(auVar33,2);
  vpextrq_avx(auVar6,1);
  auVar8 = vextracti32x4_avx512f(auVar33,3);
  vpextrq_avx(auVar8,1);
  vpextrq_avx(auVar31._0_16_,1);
  vpextrq_avx(auVar31._16_16_,1);
  auVar9 = vextracti32x4_avx512f(auVar31,2);
  vpextrq_avx(auVar9,1);
  auVar10 = vextracti32x4_avx512f(auVar31,3);
  vpextrq_avx(auVar10,1);
  auVar7 = vpunpcklqdq_avx(auVar29._0_16_,auVar28._0_16_);
  auVar11._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar7;
  auVar11._16_16_ = ZEXT116(1) * auVar32;
  auVar30._0_8_ = auVar31._0_8_;
  auVar30._8_8_ = auVar30._0_8_;
  auVar30._16_8_ = auVar30._0_8_;
  auVar30._24_8_ = auVar30._0_8_;
  auVar30 = vpblendd_avx2(auVar11,auVar30,0xc0);
  auVar7 = vpunpckhqdq_avx(auVar29._0_16_,auVar28._0_16_);
  auVar11 = vpbroadcastq_avx512vl();
  auVar11 = vpblendd_avx2(ZEXT1632(auVar7),auVar11,0x30);
  auVar12 = vpbroadcastq_avx512vl();
  auVar11 = vpblendd_avx2(auVar11,auVar12,0xc0);
  auVar30 = vpaddq_avx2(auVar30,auVar11);
  auVar11 = vpunpcklqdq_avx2(auVar29._0_32_,auVar28._0_32_);
  auVar11 = vperm2i128_avx2(auVar11,ZEXT1632(auVar33._16_16_),0x21);
  uVar38 = auVar31._16_8_;
  auVar13._8_8_ = uVar38;
  auVar13._0_8_ = uVar38;
  auVar13._16_8_ = uVar38;
  auVar13._24_8_ = uVar38;
  auVar11 = vpblendd_avx2(auVar11,auVar13,0xc0);
  auVar30 = vpaddq_avx2(auVar30,auVar11);
  auVar11 = vpunpckhqdq_avx2(auVar29._0_32_,auVar28._0_32_);
  auVar12 = vpbroadcastq_avx512vl();
  auVar11 = vperm2i128_avx2(auVar11,auVar12,0x31);
  auVar12 = vpbroadcastq_avx512vl();
  auVar11 = vpblendd_avx2(auVar11,auVar12,0xc0);
  auVar13 = vextracti64x4_avx512f(auVar29,1);
  auVar14 = vextracti64x4_avx512f(auVar28,1);
  auVar7 = vpunpckhqdq_avx(auVar13._0_16_,auVar14._0_16_);
  auVar12 = vpbroadcastq_avx512vl();
  auVar12 = vpblendd_avx2(ZEXT1632(auVar7),auVar12,0x30);
  auVar15 = vpbroadcastq_avx512vl();
  auVar12 = vpblendd_avx2(auVar12,auVar15,0xc0);
  auVar30 = vpaddq_avx2(auVar30,auVar12);
  auVar30 = vpaddq_avx2(auVar30,auVar11);
  auVar7 = vpunpcklqdq_avx(auVar13._0_16_,auVar14._0_16_);
  auVar12._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar7;
  auVar12._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
  uVar38 = auVar9._0_8_;
  auVar15._8_8_ = uVar38;
  auVar15._0_8_ = uVar38;
  auVar15._16_8_ = uVar38;
  auVar15._24_8_ = uVar38;
  auVar12 = vpblendd_avx2(auVar12,auVar15,0xc0);
  auVar11 = vpunpcklqdq_avx2(auVar13,auVar14);
  auVar11 = vperm2i128_avx2(auVar11,ZEXT1632(auVar8),0x21);
  uVar38 = auVar10._0_8_;
  auVar35._8_8_ = uVar38;
  auVar35._0_8_ = uVar38;
  auVar35._16_8_ = uVar38;
  auVar35._24_8_ = uVar38;
  auVar11 = vpblendd_avx2(auVar11,auVar35,0xc0);
  auVar11 = vpaddq_avx2(auVar12,auVar11);
  auVar12 = vpunpckhqdq_avx2(auVar13,auVar14);
  auVar13 = vpbroadcastq_avx512vl();
  auVar12 = vperm2i128_avx2(auVar12,auVar13,0x31);
  auVar13 = vpbroadcastq_avx512vl();
  auVar12 = vpblendd_avx2(auVar12,auVar13,0xc0);
  auVar11 = vpaddq_avx2(auVar11,auVar12);
  auVar30 = vpaddq_avx2(auVar30,auVar11);
  auVar7 = vpmovqd_avx512vl(auVar30);
  auVar7 = vpaddd_avx(auVar7,*(undefined1 (*) [16])(flag_counts + 4));
  *(undefined1 (*) [16])(flag_counts + 4) = auVar7;
  if ((len & 0xff) != 0) {
    uVar2 = 0;
    do {
      lVar4 = 0;
      do {
        flag_counts[lVar4] =
             flag_counts[lVar4] +
             (uint)(((byte)(*(undefined1 (*) [64])data)[uVar2] >> ((uint)lVar4 & 0x1f) & 1) != 0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (len & 0xff));
  }
  return;
}

Assistant:

void pospopcnt_u8_avx512bw_popcnt4bit(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m512i zero = _mm512_setzero_si512();

    __m512i counter_a = zero;
    __m512i counter_b = zero;
    __m512i counter_c = zero;
    __m512i counter_d = zero;
    __m512i counter_e = zero;
    __m512i counter_f = zero;
    __m512i counter_g = zero;
    __m512i counter_h = zero;

    const __m512i popcnt_4bit = _mm512_setr_epi64(
        0x0302020102010100llu, 0x0403030203020201llu,
        0x0302020102010100llu, 0x0403030203020201llu,
        0x0302020102010100llu, 0x0403030203020201llu,
        0x0302020102010100llu, 0x0403030203020201llu
    );

    const __m512i lo_nibble = _mm512_set1_epi8(0x0f);

    int local = 0;
    __m512i counter8bit_a = zero;
    __m512i counter8bit_b = zero;
    __m512i counter8bit_c = zero;
    __m512i counter8bit_d = zero;
    __m512i counter8bit_e = zero;
    __m512i counter8bit_f = zero;
    __m512i counter8bit_g = zero;
    __m512i counter8bit_h = zero;

    for (const uint8_t* end = &data[len & ~(4*64 - 1)]; data != end; data += 4*64) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m512i r0 = _mm512_loadu_si512((__m512i*)&data[0*64]);
        const __m512i r1 = _mm512_loadu_si512((__m512i*)&data[1*64]);
        const __m512i r2 = _mm512_loadu_si512((__m512i*)&data[2*64]);
        const __m512i r3 = _mm512_loadu_si512((__m512i*)&data[3*64]);

        // s0 = [a0|a1|c0|c1|e0|e1|g0|g1]
        // s1 = [b0|b1|d0|d1|f0|f1|h0|h1]
        // s2 = [a2|a3|c2|c3|e2|e3|g2|g3]
        // s3 = [b2|b3|d2|d3|f2|f3|h2|h3]
        const __m512i s0 = avx512_merge1_even(r0, r1);
        const __m512i s1 = avx512_merge1_odd (r0, r1);
        const __m512i s2 = avx512_merge1_even(r2, r3);
        const __m512i s3 = avx512_merge1_odd (r2, r3);

        // d0 = [a0|a1|a2|a3|e0|e1|e2|e3]
        // d1 = [b0|b1|b2|b3|f0|f1|f2|f3]
        // d2 = [c0|c1|c2|c3|g0|g1|g2|g3]
        // d3 = [d0|d1|d2|d3|h0|h1|h2|h3]
        const __m512i d0 = avx512_merge2_even(s0, s2);
        const __m512i d1 = avx512_merge2_even(s1, s3);
        const __m512i d2 = avx512_merge2_odd (s0, s2);
        const __m512i d3 = avx512_merge2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m512i popcnt_a = _mm512_shuffle_epi8(popcnt_4bit, d0 & lo_nibble);
        const __m512i popcnt_e = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d0, 4) & lo_nibble);
        const __m512i popcnt_b = _mm512_shuffle_epi8(popcnt_4bit, d1 & lo_nibble);
        const __m512i popcnt_f = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d1, 4) & lo_nibble);
        const __m512i popcnt_c = _mm512_shuffle_epi8(popcnt_4bit, d2 & lo_nibble);
        const __m512i popcnt_g = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d2, 4) & lo_nibble);
        const __m512i popcnt_d = _mm512_shuffle_epi8(popcnt_4bit, d3 & lo_nibble);
        const __m512i popcnt_h = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d3, 4) & lo_nibble);

        counter8bit_a = _mm512_add_epi8(counter8bit_a, popcnt_a);
        counter8bit_b = _mm512_add_epi8(counter8bit_b, popcnt_b);
        counter8bit_c = _mm512_add_epi8(counter8bit_c, popcnt_c);
        counter8bit_d = _mm512_add_epi8(counter8bit_d, popcnt_d);
        counter8bit_e = _mm512_add_epi8(counter8bit_e, popcnt_e);
        counter8bit_f = _mm512_add_epi8(counter8bit_f, popcnt_f);
        counter8bit_g = _mm512_add_epi8(counter8bit_g, popcnt_g);
        counter8bit_h = _mm512_add_epi8(counter8bit_h, popcnt_h);

        local += 1;
        if (local == 63) {
            // avoid overflows in the 8-bit counters
#define U(n) \
            counter_##n = _mm512_add_epi64(counter_##n, _mm512_sad_epu8(counter8bit_##n, zero)); \
            counter8bit_##n = _mm512_setzero_si512();

            U(a) U(b) U(c) U(d)
            U(e) U(f) U(g) U(h)
#undef U
            local = 0;
        }
    }

    if (local != 0) {
#define U(n) counter_##n = _mm512_add_epi64(counter_##n, _mm512_sad_epu8(counter8bit_##n, zero));
        U(a) U(b) U(c) U(d)
        U(e) U(f) U(g) U(h)
#undef U
    }

    flag_counts[0] += avx512_sum_epu64(counter_a);
    flag_counts[1] += avx512_sum_epu64(counter_b);
    flag_counts[2] += avx512_sum_epu64(counter_c);
    flag_counts[3] += avx512_sum_epu64(counter_d);
    flag_counts[4] += avx512_sum_epu64(counter_e);
    flag_counts[5] += avx512_sum_epu64(counter_f);
    flag_counts[6] += avx512_sum_epu64(counter_g);
    flag_counts[7] += avx512_sum_epu64(counter_h);

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % (4*64), flag_counts);
}